

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

SignLayerParams * __thiscall
CoreML::Specification::SignLayerParams::New(SignLayerParams *this,Arena *arena)

{
  SignLayerParams *this_00;
  SignLayerParams *n;
  Arena *arena_local;
  SignLayerParams *this_local;
  
  this_00 = (SignLayerParams *)operator_new(0x18);
  SignLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SignLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SignLayerParams* SignLayerParams::New(::google::protobuf::Arena* arena) const {
  SignLayerParams* n = new SignLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}